

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmac_prov.c
# Opt level: O0

int kmac_setkey(kmac_data_st *kctx,uchar *key,size_t keylen)

{
  int iVar1;
  EVP_MD *pEVar2;
  char *in_RDX;
  long in_RDI;
  int w;
  EVP_MD *digest;
  size_t in_stack_000000e0;
  size_t in_stack_000000e8;
  uchar *in_stack_000000f0;
  size_t *in_stack_000000f8;
  size_t in_stack_00000100;
  uchar *in_stack_00000108;
  EVP_MD *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int line;
  undefined4 local_4;
  
  pEVar2 = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 0x10));
  line = (int)((ulong)pEVar2 >> 0x20);
  iVar1 = EVP_MD_get_block_size(in_stack_ffffffffffffffc8);
  if ((in_RDX < (char *)0x4) || ((char *)0x100 < in_RDX)) {
    ERR_new();
    ERR_set_debug(in_RDX,line,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    ERR_set_error(0x39,0x69,(char *)0x0);
    local_4 = 0;
  }
  else if (iVar1 < 0) {
    ERR_new();
    ERR_set_debug(in_RDX,line,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    ERR_set_error(0x39,0xa6,(char *)0x0);
    local_4 = 0;
  }
  else {
    iVar1 = kmac_bytepad_encode_key
                      (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
                       in_stack_000000e8,in_stack_000000e0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int kmac_setkey(struct kmac_data_st *kctx, const unsigned char *key,
                       size_t keylen)
{
    const EVP_MD *digest = ossl_prov_digest_md(&kctx->digest);
    int w = EVP_MD_get_block_size(digest);

    if (keylen < KMAC_MIN_KEY || keylen > KMAC_MAX_KEY) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY_LENGTH);
        return 0;
    }
    if (w < 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_DIGEST_LENGTH);
        return 0;
    }
    if (!kmac_bytepad_encode_key(kctx->key, sizeof(kctx->key), &kctx->key_len,
                                 key, keylen, (size_t)w))
        return 0;
    return 1;
}